

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::distance_comparison_task
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  vec<6U,_float> *this_00;
  vec<6U,_float> *this_01;
  vec<6U,_float> *pvVar4;
  ulong uVar5;
  uint i;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  this_00 = *pData_ptr;
  this_01 = *(vec<6U,_float> **)((long)pData_ptr + 8);
  iVar1 = *(int *)((long)pData_ptr + 0x10);
  uVar5 = (ulong)(uint)(*(int *)((long)pData_ptr + 0x14) - iVar1);
  uVar2 = *(uint *)((long)pData_ptr + 0x18);
  for (uVar6 = (ulong)(uint)((int)((uVar5 * data) / (ulong)uVar2) + iVar1);
      uVar6 < (uint)((int)(((data + 1) * uVar5) / (ulong)uVar2) + iVar1); uVar6 = uVar6 + 1) {
    uVar3 = (this->m_vectorsInfo).m_p[uVar6].index;
    pvVar4 = this->m_vectors;
    fVar7 = vec<6U,_float>::squared_distance(this_00,pvVar4 + uVar3);
    fVar8 = vec<6U,_float>::squared_distance(this_01,pvVar4 + uVar3);
    (this->m_vectorComparison).m_p[uVar6] = fVar7 < fVar8;
  }
  return;
}

Assistant:

void distance_comparison_task(uint64 data, void* pData_ptr) {
    distance_comparison_task_params* pParams = (distance_comparison_task_params*)pData_ptr;
    const VectorType& left_child = *pParams->left_child;
    const VectorType& right_child = *pParams->right_child;
    uint begin = pParams->begin + (pParams->end - pParams->begin) * data / pParams->num_tasks;
    uint end = pParams->begin + (pParams->end - pParams->begin) * (data + 1) / pParams->num_tasks;
    for (uint i = begin; i < end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      m_vectorComparison[i] = left_dist2 < right_dist2;
    }
  }